

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  uchar c_00;
  uchar *puVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  int local_34;
  char local_30;
  uchar local_2e;
  uchar local_2d;
  int utf8;
  char num;
  char skipping;
  char s_eq;
  char d_eq;
  char s_star;
  char s_dot;
  char s_minus;
  char d_star;
  char d_dot;
  char d_minus;
  char flo;
  char c;
  lws_tokenize_state state;
  char *rfc7230_delims;
  lws_tokenize *ts_local;
  
  _s_star = 0;
  bVar3 = false;
  skipping = '-';
  num = '.';
  utf8._3_1_ = '*';
  utf8._2_1_ = '\0';
  utf8._1_1_ = '\0';
  utf8._0_1_ = '\0';
  local_2d = '=';
  local_2e = '\0';
  bVar2 = false;
  local_30 = -1;
  if ((ts->flags & 0x40) != 0) {
    local_30 = '\0';
  }
  local_34 = 0;
  if ((ts->flags & 1) != 0) {
    skipping = '\0';
    utf8._2_1_ = '-';
  }
  if ((ts->flags & 0x10) != 0) {
    num = '\0';
    utf8._1_1_ = '.';
  }
  if ((ts->flags & 0x200) != 0) {
    utf8._3_1_ = '\0';
    utf8._0_1_ = '*';
  }
  if ((ts->flags & 0x400) != 0) {
    local_2d = '\0';
    local_2e = '=';
  }
  ts->token = (char *)0x0;
  ts->token_len = 0;
LAB_00109e34:
  if (ts->len == 0) {
LAB_0010a35d:
    if (local_34 != 0) {
      return LWS_TOKZE_ERR_BROKEN_UTF8;
    }
    if (_s_star == 1) {
      return LWS_TOKZE_ERR_UNTERM_STRING;
    }
    if ((_s_star != 3) && (_s_star != 2)) {
      if (((ts->flags & 4) != 0) && (ts->delim == '\x02')) {
        return LWS_TOKZE_ERR_COMMA_LIST;
      }
      return LWS_TOKZE_ENDED;
    }
    goto LAB_0010a3b8;
  }
  puVar1 = (uchar *)ts->start;
  ts->start = (char *)(puVar1 + 1);
  c_00 = *puVar1;
  ts->len = ts->len - 1;
  local_34 = lws_check_byte_utf8((uchar)local_34,c_00);
  if (local_34 < 0) {
    return LWS_TOKZE_ERR_BROKEN_UTF8;
  }
  if (c_00 == '\0') goto LAB_0010a35d;
  if (bVar2) {
    if ((c_00 != '\r') && (c_00 != '\n')) goto LAB_00109e34;
    bVar2 = false;
  }
  if ((((ts->flags & 0x80) != 0) && (_s_star != 1)) && (c_00 == '#')) {
    bVar2 = true;
    goto LAB_00109e34;
  }
  if (((c_00 == ' ') || (c_00 == '\t')) || ((c_00 == '\n' || ((c_00 == '\r' || (c_00 == '\f')))))) {
    switch(_s_star) {
    case 0:
    case 3:
      goto LAB_00109e34;
    case 1:
      ts->token_len = ts->token_len + 1;
      goto LAB_00109e34;
    case 2:
      _s_star = 3;
      goto LAB_00109e34;
    }
  }
  if (c_00 != '\"') {
    if ((((ts->flags & 0x400) == 0) && (c_00 == '=')) && ((_s_star == 3 || (_s_star == 2)))) {
      if (local_30 == '\x01') {
        return LWS_TOKZE_ERR_NUM_ON_LHS;
      }
      return LWS_TOKZE_ERRS;
    }
    if ((((ts->flags & 2) != 0) && (c_00 == ':')) && ((_s_star == 3 || (_s_star == 2)))) {
      return LWS_TOKZE_TOKEN_NAME_COLON;
    }
    if ((((c_00 == '.') && ((ts->flags & 0x20) == 0)) && (_s_star == 2)) && (local_30 == '\x01')) {
      if (bVar3) {
        return LWS_TOKZE_ERR_MALFORMED_FLOAT;
      }
      bVar3 = true;
      ts->token_len = ts->token_len + 1;
      goto LAB_00109e34;
    }
    if (((local_34 == 0) &&
        (((((ts->flags & 8) != 0 &&
           (pcVar4 = strchr("(),/:;<=>?@[\\]{}",(int)(char)c_00), pcVar4 != (char *)0x0)) &&
          (' ' < (char)c_00)) ||
         ((((((ts->flags & 8) == 0 && (((char)c_00 < '0' || ('9' < (char)c_00)))) &&
            (((char)c_00 < 'A' || ('Z' < (char)c_00)))) &&
           (((((char)c_00 < 'a' || ('z' < (char)c_00)) && (c_00 != '_')) &&
            (((c_00 != utf8._2_1_ && (c_00 != utf8._1_1_)) &&
             ((c_00 != (uchar)utf8 && (c_00 != local_2e)))))))) ||
          ((((c_00 == skipping || (c_00 == num)) || (c_00 == utf8._3_1_)) || (c_00 == local_2d))))))
        )) && (((ts->flags & 0x100) == 0 || (c_00 != '/')))) {
      if (_s_star == 0) {
        if ((ts->flags & 4) != 0) {
          if ((c_00 != ',') || (ts->delim != '\x01')) {
            return LWS_TOKZE_ERR_COMMA_LIST;
          }
          ts->delim = '\x02';
        }
        ts->token = ts->start + -1;
        ts->token_len = 1;
        return LWS_TOKZE_DELIMITER;
      }
      if (_s_star == 1) {
        ts->token_len = ts->token_len + 1;
        goto LAB_00109e34;
      }
      if (_s_star - 2U < 2) {
        ts->start = ts->start + -1;
        ts->len = ts->len + 1;
        goto LAB_0010a3b8;
      }
    }
    if (_s_star == 0) {
      if ((ts->flags & 4) != 0) {
        if (ts->delim == '\x01') {
          return LWS_TOKZE_ERR_COMMA_LIST;
        }
        ts->delim = '\x01';
      }
      _s_star = 2;
      ts->token = ts->start + -1;
      ts->token_len = 1;
LAB_0010a2fa:
      if ((ts->flags & 0x40) == 0) {
        if (((char)c_00 < '0') || ('9' < (char)c_00)) {
          local_30 = '\0';
        }
        else if (local_30 < '\0') {
          local_30 = '\x01';
        }
      }
    }
    else {
      if (_s_star - 1U < 2) {
        ts->token_len = ts->token_len + 1;
        goto LAB_0010a2fa;
      }
      if (_s_star == 3) {
        ts->start = ts->start + -1;
        ts->len = ts->len + 1;
LAB_0010a3b8:
        if (local_30 == '\x01') {
          if (bVar3) {
            ts_local._4_4_ = LWS_TOKZE_FLOAT;
          }
          else {
            ts_local._4_4_ = LWS_TOKZE_INTEGER;
          }
        }
        else {
          ts_local._4_4_ = LWS_TOKZE_TOKEN;
        }
        return ts_local._4_4_;
      }
    }
    goto LAB_00109e34;
  }
  if (_s_star == 1) {
    return LWS_TOKZE_QUOTED_STRING;
  }
  if ((ts->flags & 4) != 0) {
    if (ts->delim == '\x01') {
      return LWS_TOKZE_ERR_COMMA_LIST;
    }
    ts->delim = '\x01';
  }
  _s_star = 1;
  ts->token = ts->start;
  ts->token_len = 0;
  goto LAB_00109e34;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', d_star = '*', s_minus = '\0',
	     s_dot = '\0', s_star = '\0', d_eq = '=', s_eq = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}
	if (ts->flags & LWS_TOKENIZE_F_ASTERISK_NONTERM) {
		d_star = '\0';
		s_star = '*';
	}
	if (ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) {
		d_eq = '\0';
		s_eq = '=';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, (unsigned char)c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (!(ts->flags & LWS_TOKENIZE_F_EQUALS_NONTERM) &&
		    c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot && c != s_star && c != s_eq) ||
		    c == d_minus || c == d_dot || c == d_star || c == d_eq
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}